

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test6::executeIteration(GPUShaderFP64Test6 *this,_test_case *test_case)

{
  deUint32 dVar1;
  RenderContext *pRVar2;
  GLuint extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1e0;
  int local_5c;
  GLuint local_58;
  GLint compile_status;
  GLuint so_id;
  uint n_so_id;
  char *stage_name;
  char *stage_body;
  GLuint GStack_38;
  bool result;
  uint n_so_ids;
  GLuint so_ids [6];
  Functions *gl;
  _test_case *test_case_local;
  GPUShaderFP64Test6 *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  so_ids[4] = (*pRVar2->_vptr_RenderContext[3])();
  so_ids[5] = extraout_var;
  GStack_38 = this->m_cs_id;
  n_so_ids = this->m_fs_id;
  so_ids[0] = this->m_gs_id;
  so_ids[1] = this->m_tc_id;
  so_ids[2] = this->m_te_id;
  so_ids[3] = this->m_vs_id;
  stage_body._4_4_ = 6;
  stage_body._3_1_ = 1;
  stage_name = (char *)0x0;
  _so_id = (char *)0x0;
  for (compile_status = 0; (uint)compile_status < 6; compile_status = compile_status + 1) {
    local_58 = *(GLuint *)((long)&stack0xffffffffffffffc8 + (ulong)(uint)compile_status * 4);
    if (local_58 != 0) {
      (**(code **)(so_ids._16_8_ + 0x248))(local_58);
      dVar1 = (**(code **)(so_ids._16_8_ + 0x800))();
      glu::checkError(dVar1,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x206b);
      local_5c = 1;
      (**(code **)(so_ids._16_8_ + 0xa70))(local_58,0x8b81,&local_5c);
      dVar1 = (**(code **)(so_ids._16_8_ + 0x800))();
      glu::checkError(dVar1,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x2071);
      if (local_5c == 1) {
        if (local_58 == this->m_cs_id) {
          stage_name = (char *)std::__cxx11::string::c_str();
          _so_id = "Compute shader";
        }
        else if (local_58 == this->m_fs_id) {
          stage_name = (char *)std::__cxx11::string::c_str();
          _so_id = "Fragment shader";
        }
        else if (local_58 == this->m_gs_id) {
          stage_name = (char *)std::__cxx11::string::c_str();
          _so_id = "Geometry shader";
        }
        else if (local_58 == this->m_tc_id) {
          stage_name = (char *)std::__cxx11::string::c_str();
          _so_id = "Tessellation control shader";
        }
        else if (local_58 == this->m_te_id) {
          stage_name = (char *)std::__cxx11::string::c_str();
          _so_id = "Tessellation evaluation shader";
        }
        else if (local_58 == this->m_vs_id) {
          stage_name = (char *)std::__cxx11::string::c_str();
          _so_id = "Vertex shader";
        }
        else {
          stage_name = "";
          _so_id = "[?]";
        }
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<(&local_1e0,(char **)&so_id);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (pMVar3,(char (*) [98])
                                   " has been compiled successfully, even though the shader was malformed. Following is shader body:\n"
                           );
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stage_name);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e0);
        stage_body._3_1_ = 0;
      }
    }
  }
  return (bool)(stage_body._3_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test6::executeIteration(const _test_case& test_case)
{
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	const glw::GLuint	 so_ids[]   = { m_cs_id, m_fs_id, m_gs_id, m_tc_id, m_te_id, m_vs_id };
	const unsigned int	n_so_ids   = sizeof(so_ids) / sizeof(so_ids[0]);
	bool				  result	 = true;
	const char*			  stage_body = NULL;
	const char*			  stage_name = NULL;

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		const glw::GLuint so_id = so_ids[n_so_id];

		/* Skip compute shader if it is not supported */
		if (0 == so_id)
		{
			continue;
		}

		/* Compile the shader */
		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		/* Has the compilation failed as expected? */
		glw::GLint compile_status = GL_TRUE;

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status == GL_TRUE)
		{
			/* What is the current stage's name? */
			if (so_id == m_cs_id)
			{
				stage_body = test_case.cs_shader_body.c_str();
				stage_name = "Compute shader";
			}
			else if (so_id == m_fs_id)
			{
				stage_body = test_case.fs_shader_body.c_str();
				stage_name = "Fragment shader";
			}
			else if (so_id == m_gs_id)
			{
				stage_body = test_case.gs_shader_body.c_str();
				stage_name = "Geometry shader";
			}
			else if (so_id == m_tc_id)
			{
				stage_body = test_case.tc_shader_body.c_str();
				stage_name = "Tessellation control shader";
			}
			else if (so_id == m_te_id)
			{
				stage_body = test_case.te_shader_body.c_str();
				stage_name = "Tessellation evaluation shader";
			}
			else if (so_id == m_vs_id)
			{
				stage_body = test_case.vs_shader_body.c_str();
				stage_name = "Vertex shader";
			}
			else
			{
				/* Doesn't make much sense to throw exceptions here so.. */
				stage_body = "";
				stage_name = "[?]";
			}

			/* This shader should have never compiled successfully! */
			m_testCtx.getLog() << tcu::TestLog::Message << stage_name
							   << " has been compiled successfully, even though the shader was malformed."
								  " Following is shader body:\n"
							   << stage_body << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all shader objects) */

	return result;
}